

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NtkEliminateSpecial(Abc_Ntk_t *pNtk,int nMaxSize,int fVerbose)

{
  size_t __size;
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *vNodes;
  void **ppvVar6;
  int *pPermFanin;
  int *pPermFanout;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong local_68;
  
  if (nMaxSize < 1) {
    __assert_fail("nMaxSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                  ,0x2db,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                  ,0x2dc,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  iVar3 = Abc_NtkToBdd(pNtk);
  if (iVar3 == 0) {
LAB_001ded96:
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    iVar3 = 0;
  }
  else {
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    Abc_NtkCleanup(pNtk,0);
    iVar3 = Abc_NtkToSop(pNtk,-1,1000000000);
    if (iVar3 == 0) {
      fwrite("Converting to SOP has failed.\n",0x1e,1,_stdout);
      return 0;
    }
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 1000;
    vNodes->nSize = 0;
    ppvVar6 = (void **)malloc(8000);
    vNodes->pArray = ppvVar6;
    pVVar7 = pNtk->vObjs;
    if (0 < pVVar7->nSize) {
      uVar11 = 0;
      local_68 = 1000;
      lVar12 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar7->pArray[lVar12];
        if (((((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) &&
             ((pAVar1->vFanouts).nSize == 1)) &&
            ((pAVar8 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray],
             (*(uint *)&pAVar8->field_0x14 & 0xf) == 7 &&
             (iVar3 = Abc_SopGetCubeNum((char *)(pAVar1->field_5).pData), iVar3 == 1)))) &&
           (iVar3 = Abc_SopGetCubeNum((char *)(pAVar8->field_5).pData), iVar3 == 1)) {
          iVar3 = Abc_NodeFindFanin(pAVar8,pAVar1);
          if ((iVar3 < 0) || ((pAVar8->vFanins).nSize <= iVar3)) {
            __assert_fail("RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                          ,0x301,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
          }
          iVar4 = Abc_SopIsComplement((char *)(pAVar1->field_5).pData);
          iVar3 = Abc_SopGetIthCareLit((char *)(pAVar8->field_5).pData,iVar3);
          if (iVar4 != iVar3) {
            uVar5 = (uint)local_68;
            if (uVar11 == uVar5) {
              if ((int)uVar5 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar6;
                vNodes->nCap = 0x10;
                local_68 = 0x10;
              }
              else {
                local_68 = (ulong)(uVar5 * 2);
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(local_68 * 8);
                }
                else {
                  ppvVar6 = (void **)realloc(vNodes->pArray,local_68 * 8);
                }
                vNodes->pArray = ppvVar6;
                vNodes->nCap = uVar5 * 2;
              }
            }
            else {
              ppvVar6 = vNodes->pArray;
            }
            lVar9 = (long)(int)uVar11;
            uVar11 = uVar11 + 1;
            vNodes->nSize = uVar11;
            ppvVar6[lVar9] = pAVar1;
          }
        }
        lVar12 = lVar12 + 1;
        pVVar7 = pNtk->vObjs;
      } while (lVar12 < pVVar7->nSize);
      if (uVar11 != 0) {
        Abc_ObjSortInReverseOrder(pNtk,vNodes);
        iVar3 = Abc_NtkToBdd(pNtk);
        if (iVar3 != 0) {
          __size = (ulong)(uint)nMaxSize * 4 + 4000;
          pPermFanin = (int *)malloc(__size);
          pPermFanout = (int *)malloc(__size);
          pVVar7 = (Vec_Ptr_t *)malloc(0x10);
          pVVar7->nCap = 1000;
          pVVar7->nSize = 0;
          ppvVar6 = (void **)malloc(8000);
          pVVar7->pArray = ppvVar6;
          vNodes_00 = (Vec_Ptr_t *)malloc(0x10);
          vNodes_00->nCap = 1000;
          vNodes_00->nSize = 0;
          ppvVar6 = (void **)malloc(8000);
          vNodes_00->pArray = ppvVar6;
          if (0 < (int)uVar11) {
            ppvVar6 = vNodes->pArray;
            uVar10 = 0;
            do {
              pAVar1 = (Abc_Obj_t *)ppvVar6[uVar10];
              if ((*(uint *)&pAVar1->field_0x14 & 0xf) != 7) {
                __assert_fail("Abc_ObjIsNode(pNode)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                              ,0x31c,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
              }
              pAVar8 = Abc_NodeFindCoFanout(pAVar1);
              if (pAVar8 != (Abc_Obj_t *)0x0) {
                __assert_fail("Abc_NodeFindCoFanout(pNode) == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                              ,0x31d,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
              }
              Abc_NodeCollectFanouts(pAVar1,vNodes_00);
              if (0 < vNodes_00->nSize) {
                lVar12 = 0;
                do {
                  pAVar8 = (Abc_Obj_t *)vNodes_00->pArray[lVar12];
                  if (fVerbose == 0) {
                    iVar3 = Abc_NodeCollapse(pAVar1,pAVar8,pVVar7,pPermFanin,pPermFanout);
                    if (iVar3 == 0) goto LAB_001dee09;
                  }
                  else {
                    printf("Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                           (ulong)(uint)pAVar1->Id,(ulong)(uint)(pAVar1->vFanins).nSize,
                           (ulong)(uint)pAVar8->Id,(ulong)(uint)(pAVar8->vFanins).nSize);
                    iVar3 = Abc_NodeCollapse(pAVar1,pAVar8,pVVar7,pPermFanin,pPermFanout);
                    if (iVar3 == 0) {
LAB_001dee09:
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                                    ,0x326,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
                    }
                    lVar9 = (long)pNtk->vObjs->nSize;
                    if (lVar9 < 1) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    pvVar2 = pNtk->vObjs->pArray[lVar9 + -1];
                    if (pvVar2 != (void *)0x0) {
                      printf("resulting in node %5d (supp =%2d).\n",
                             (ulong)*(uint *)((long)pvVar2 + 0x10),
                             (ulong)*(uint *)((long)pvVar2 + 0x1c));
                    }
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 < vNodes_00->nSize);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar11);
          }
          Abc_NtkBddReorder(pNtk,0);
          if (pVVar7->pArray != (void **)0x0) {
            free(pVVar7->pArray);
          }
          free(pVVar7);
          if (vNodes_00->pArray != (void **)0x0) {
            free(vNodes_00->pArray);
          }
          free(vNodes_00);
          if (vNodes->pArray != (void **)0x0) {
            free(vNodes->pArray);
          }
          free(vNodes);
          if (pPermFanin != (int *)0x0) {
            free(pPermFanin);
          }
          if (pPermFanout == (int *)0x0) {
            return 1;
          }
          free(pPermFanout);
          return 1;
        }
        goto LAB_001ded96;
      }
    }
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
    }
    free(vNodes);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Abc_NtkEliminateSpecial( Abc_Ntk_t * pNtk, int nMaxSize, int fVerbose )
{
    extern void Abc_NtkBddReorder( Abc_Ntk_t * pNtk, int fVerbose );
    Vec_Ptr_t * vFanouts, * vFanins, * vNodes;
    Abc_Obj_t * pNode, * pFanout;
    int * pPermFanin, * pPermFanout;
    int RetValue, i, k;
    assert( nMaxSize > 0 );
    assert( Abc_NtkIsLogic(pNtk) ); 


    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins( pNtk );
    Abc_NtkMinimumBase( pNtk );
    Abc_NtkCleanup( pNtk, 0 );

    // convert network to SOPs
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 0;
    }

    // collect info about the nodes to be eliminated
    vNodes = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFanoutNum(pNode) != 1 )
            continue;
        pFanout = Abc_ObjFanout0(pNode);
        if ( !Abc_ObjIsNode(pFanout) )
            continue;
        if ( Abc_SopGetCubeNum((char *)pNode->pData) != 1 )
            continue;
        if ( Abc_SopGetCubeNum((char *)pFanout->pData) != 1 )
            continue;
        // find the fanout's fanin
        RetValue = Abc_NodeFindFanin( pFanout, pNode );
        assert( RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout) );
        // both pNode and pFanout are AND/OR type nodes
        if ( Abc_SopIsComplement((char *)pNode->pData) == Abc_SopGetIthCareLit((char *)pFanout->pData, RetValue) )
            continue;
        Vec_PtrPush( vNodes, pNode );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
        return 1;
    }
    Abc_ObjSortInReverseOrder( pNtk, vNodes );

    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // go through the nodes and decide is they can be eliminated
    pPermFanin = ABC_ALLOC( int, nMaxSize + 1000 );
    pPermFanout = ABC_ALLOC( int, nMaxSize + 1000 );
    vFanins = Vec_PtrAlloc( 1000 );
    vFanouts = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( Abc_ObjIsNode(pNode) );
        assert( Abc_NodeFindCoFanout(pNode) == NULL );
        // perform elimination
        Abc_NodeCollectFanouts( pNode, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
        {
            if ( fVerbose )
                printf( "Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                    Abc_ObjId(pNode), Abc_ObjFaninNum(pNode), Abc_ObjId(pFanout), Abc_ObjFaninNum(pFanout) ); 
            RetValue = Abc_NodeCollapse( pNode, pFanout, vFanins, pPermFanin, pPermFanout );
            assert( RetValue );
            if ( fVerbose )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk) - 1 );
                if ( pNodeNew )
                    printf( "resulting in node %5d (supp =%2d).\n", Abc_ObjId(pNodeNew), Abc_ObjFaninNum(pNodeNew) );
            }
        }
    }
    Abc_NtkBddReorder( pNtk, 0 );
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    ABC_FREE( pPermFanin );
    ABC_FREE( pPermFanout );
    return 1;
}